

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff.hpp
# Opt level: O2

void __thiscall sf2cute::RIFF::~RIFF(RIFF *this)

{
  this->_vptr_RIFF = (_func_int **)&PTR__RIFF_0011d990;
  std::
  vector<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>,_std::allocator<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>_>_>
  ::~vector(&this->chunks_);
  std::__cxx11::string::~string((string *)&this->name_);
  return;
}

Assistant:

virtual ~RIFF() = default;